

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Block::ReadFile(Block *this)

{
  byte bVar1;
  ostream *poVar2;
  fpos<__mbstate_t> local_238 [2];
  string local_218 [8];
  ifstream in;
  Block *this_local;
  
  std::ifstream::ifstream(local_218);
  std::operator|(_S_in,_S_bin);
  std::ifstream::open(local_218,(_Ios_Openmode)this);
  bVar1 = std::ios::bad();
  if ((bVar1 & 1) == 0) {
    std::fpos<__mbstate_t>::fpos(local_238,(long)(this->FileOff << 0xd));
    std::istream::seekg(local_218,local_238[0]._M_off,local_238[0]._M_state);
    std::istream::read((char *)local_218,(long)this->data);
    std::ifstream::close();
    std::ifstream::~ifstream(local_218);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)this);
  poVar2 = std::operator<<(poVar2,": No such a file!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  system("pause");
  exit(1);
}

Assistant:

void Block::ReadFile(void) {
	ifstream in;
	in.open(this->FileName, ios::in | ios::binary);
	if (in.bad()) {
		cout << this->FileName << ": No such a file!" << endl;
		system("pause");
		exit(1);
	}
	in.seekg(this->FileOff * BLOCK_SIZE);
	//cout << in.tellg() << endl;
	in.read(reinterpret_cast<char*> (this->data), BLOCK_SIZE);
	in.close();
}